

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

void __thiscall
MemoryLeakDetector::storeLeakInformation
          (MemoryLeakDetector *this,MemoryLeakDetectorNode *node,char *new_memory,size_t size,
          TestMemoryAllocator *allocator,char *file,size_t line)

{
  MemoryLeakDetectorNode MVar1;
  uint uVar2;
  MemLeakPeriod MVar3;
  
  uVar2 = this->allocationSequenceNumber_;
  this->allocationSequenceNumber_ = uVar2 + 1;
  MVar3 = this->current_period_;
  MVar1 = (MemoryLeakDetectorNode)this->current_allocation_stage_;
  *(uint *)(node + 8) = uVar2;
  *(char **)(node + 0x10) = new_memory;
  *(size_t *)node = size;
  *(TestMemoryAllocator **)(node + 0x28) = allocator;
  *(MemLeakPeriod *)(node + 0x30) = MVar3;
  node[0x34] = MVar1;
  *(char **)(node + 0x18) = file;
  *(size_t *)(node + 0x20) = line;
  addMemoryCorruptionInformation((MemoryLeakDetector *)(ulong)MVar3,new_memory + size);
  *(MemoryLeakDetectorNode **)(node + 0x38) =
       (this->memoryTable_).table_[*(ulong *)(node + 0x10) % 0x49].head_;
  (this->memoryTable_).table_[*(ulong *)(node + 0x10) % 0x49].head_ = node;
  return;
}

Assistant:

void MemoryLeakDetector::storeLeakInformation(MemoryLeakDetectorNode * node, char *new_memory, size_t size, TestMemoryAllocator *allocator, const char *file, size_t line)
{
    node->init(new_memory, allocationSequenceNumber_++, size, allocator, current_period_, current_allocation_stage_, file, line);
    addMemoryCorruptionInformation(node->memory_ + node->size_);
    memoryTable_.addNewNode(node);
}